

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

void fy_emit_mapping_key_epilog(fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_key)

{
  fy_emitter_cfg_flags fVar1;
  int indent;
  uint flags;
  int extraout_EDX;
  int extraout_EDX_00;
  int flags_00;
  
  if ((fyt_key != (fy_token *)0x0) && (fyt_key->type == FYTT_ALIAS)) {
    fy_emit_putc(emit,fyewt_whitespace,0x20);
    *(byte *)&emit->flags = (byte)emit->flags | 1;
  }
  flags = sc->flags & 0xfffffffb;
  sc->flags = flags;
  fy_emit_write_indicator(emit,di_colon,flags,sc->indent,fyewt_indicator);
  if ((fyt_key != (fy_token *)0x0) && (fyt_key->comment[1].fyi != (fy_input *)0x0)) {
    indent = sc->indent;
    flags_00 = extraout_EDX;
    if (((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) == (undefined1  [40])0x0)
       && (fVar1 = emit->cfg->flags,
          (fVar1 & 0xf00000) != FYECF_MODE_JSON_ONELINE && (fVar1 & 0xe00000) != FYECF_MODE_JSON)) {
      indent = fy_emit_increase_indent(emit,sc->flags,indent);
      flags_00 = extraout_EDX_00;
    }
    fy_emit_token_comment(emit,fyt_key,flags_00,indent,fycp_right);
    fy_emit_write_indent(emit,indent);
  }
  sc->flags = sc->flags & 0x10U | 4;
  return;
}

Assistant:

static void fy_emit_mapping_key_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                       struct fy_token *fyt_key) {
    int tmp_indent;

    /* if the key is an alias, always output an extra whitespace */
    if (fyt_key && fyt_key->type == FYTT_ALIAS)
        fy_emit_write_ws(emit);

    sc->flags &= ~DDNF_MAP;

    fy_emit_write_indicator(emit, di_colon, sc->flags, sc->indent, fyewt_indicator);

    tmp_indent = sc->indent;
    if (fy_emit_token_has_comment(emit, fyt_key, fycp_right)) {

        if (!sc->flow && !fy_emit_is_json_mode(emit))
            tmp_indent = fy_emit_increase_indent(emit, sc->flags, sc->indent);

        fy_emit_token_comment(emit, fyt_key, sc->flags, tmp_indent, fycp_right);
        fy_emit_write_indent(emit, tmp_indent);
    }

    sc->flags = DDNF_MAP | (sc->flags & DDNF_FLOW);
}